

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_search_localfile
              (char **searchpaths,int cwd,char *name,char *revision,char **localfile,
              LYS_INFORMAT *format)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ly_set *set;
  size_t __n;
  lys_node *__name;
  long lVar5;
  DIR *pDVar6;
  size_t sVar7;
  dirent *pdVar8;
  int *piVar9;
  char *pcVar10;
  size_t __n_00;
  char *pcVar11;
  char **ppcVar12;
  ulong uVar13;
  LYS_INFORMAT LVar14;
  LYS_INFORMAT LVar15;
  undefined1 local_128 [8];
  stat st;
  long local_58;
  char *local_48;
  char *wn;
  DIR *local_38;
  
  local_48 = (char *)0x0;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_search_localfile");
    return 1;
  }
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile")
    ;
    return 1;
  }
  __n = strlen(name);
  if (cwd == 0) {
    bVar2 = false;
LAB_0015c577:
    if ((searchpaths != (char **)0x0) && (pcVar11 = *searchpaths, pcVar11 != (char *)0x0)) {
      ppcVar12 = searchpaths + 1;
      do {
        if ((bVar2) && (iVar3 = strcmp((char *)*(set->set).s,pcVar11), iVar3 == 0)) {
          bVar2 = false;
        }
        else {
          __name = (lys_node *)strdup(pcVar11);
          if (__name == (lys_node *)0x0) goto LAB_0015c967;
          iVar3 = ly_set_add(set,__name,0);
          if (iVar3 == -1) goto LAB_0015ca02;
        }
        pcVar11 = *ppcVar12;
        ppcVar12 = ppcVar12 + 1;
      } while (pcVar11 != (char *)0x0);
    }
    if (set->number == 0) {
      __name = (lys_node *)0x0;
      wn = (char *)0x0;
      LVar15 = LYS_IN_UNKNOWN;
      pDVar6 = (DIR *)0x0;
    }
    else {
      lVar5 = __n + 1;
      LVar15 = LYS_IN_UNKNOWN;
      wn = (char *)0x0;
      local_58 = 0;
      __name = (lys_node *)0x0;
      pDVar6 = (DIR *)0x0;
      do {
        free(__name);
        free(local_48);
        local_48 = (char *)0x0;
        uVar4 = set->number - 1;
        set->number = uVar4;
        __name = (set->set).s[uVar4];
        (set->set).s[uVar4] = (lys_node *)0x0;
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in %s.",name,__name);
        if (pDVar6 != (DIR *)0x0) {
          closedir(pDVar6);
        }
        pDVar6 = opendir((char *)__name);
        sVar7 = strlen((char *)__name);
        local_38 = pDVar6;
        if (pDVar6 == (DIR *)0x0) {
          piVar9 = __errno_location();
          pcVar11 = strerror(*piVar9);
          ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                 "Unable to open directory \"%s\" for searching (sub)modules (%s).",__name,pcVar11);
        }
        else {
          pdVar8 = readdir(pDVar6);
          if (pdVar8 != (dirent *)0x0) {
            LVar14 = LVar15;
            do {
              if ((byte)pdVar8->d_name[0] == 0x2e) {
                if (pdVar8->d_name[1] != '\0') {
                  uVar4 = (byte)pdVar8->d_name[1] - 0x2e;
                  if (uVar4 == 0) {
                    uVar4 = (uint)(byte)pdVar8->d_name[2];
                  }
                  iVar3 = -uVar4;
                  goto LAB_0015c6df;
                }
              }
              else {
                iVar3 = 0x2e - (uint)(byte)pdVar8->d_name[0];
LAB_0015c6df:
                if (iVar3 != 0) {
                  pcVar11 = pdVar8->d_name;
                  free(local_48);
                  iVar3 = asprintf(&local_48,"%s/%s",__name,pcVar11);
                  if (iVar3 == -1) {
                    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "lys_search_localfile");
LAB_0015c9bb:
                    iVar3 = 1;
                    pcVar11 = wn;
                    pDVar6 = local_38;
                    goto LAB_0015ca08;
                  }
                  iVar3 = stat(local_48,(stat *)local_128);
                  if (iVar3 == -1) {
                    piVar9 = __errno_location();
                    pcVar10 = strerror(*piVar9);
                    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                           "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                           ,pcVar11,__name,pcVar10);
                  }
                  else if (((uint)st.st_nlink & 0xf000) == 0x8000) {
                    iVar3 = strncmp(name,pcVar11,__n);
                    if ((iVar3 == 0) && ((cVar1 = pcVar11[__n], cVar1 == '@' || (cVar1 == '.')))) {
                      st.__glibc_reserved[2] = strlen(pcVar11);
                      iVar3 = strcmp(pcVar11 + (st.__glibc_reserved[2] - 4),".yin");
                      if (iVar3 == 0) {
                        LVar15 = LYS_IN_YIN;
                      }
                      else {
                        iVar3 = strcmp(pcVar11 + st.__glibc_reserved[2] + -5,".yang");
                        if (iVar3 != 0) goto LAB_0015c82a;
                        LVar15 = LYS_IN_YANG;
                      }
                      if (revision == (char *)0x0) {
                        if (wn == (char *)0x0) goto LAB_0015c90b;
                        if (cVar1 == '@') {
                          iVar3 = lyp_check_date((ly_ctx *)0x0,pcVar11 + lVar5);
                          if ((iVar3 == 0) &&
                             ((wn[local_58] != '@' ||
                              (iVar3 = strncmp(wn + local_58 + 1,pcVar11 + lVar5,10), iVar3 < 0))))
                          goto LAB_0015c906;
                        }
                      }
                      else if (cVar1 == '@') {
                        __n_00 = strlen(revision);
                        iVar3 = strncmp(revision,pcVar11 + lVar5,__n_00);
                        if (iVar3 == 0) {
                          free(wn);
                          wn = local_48;
                          local_48 = (char *)0x0;
                          pDVar6 = local_38;
                          goto LAB_0015c9d2;
                        }
                      }
                      else {
LAB_0015c906:
                        free(wn);
LAB_0015c90b:
                        wn = local_48;
                        local_48 = (char *)0x0;
                        LVar14 = LVar15;
                        local_58 = sVar7 + lVar5;
                      }
                    }
                  }
                  else if ((((uint)st.st_nlink & 0xf000) == 0x4000) && (set->number != 0 || !bVar2))
                  {
                    iVar3 = ly_set_add(set,local_48,0);
                    if (iVar3 == -1) goto LAB_0015c9bb;
                    local_48 = (char *)0x0;
                  }
                }
              }
LAB_0015c82a:
              pdVar8 = readdir(local_38);
              LVar15 = LVar14;
            } while (pdVar8 != (dirent *)0x0);
          }
        }
        pDVar6 = local_38;
      } while (set->number != 0);
    }
LAB_0015c9d2:
    *localfile = wn;
    if (format == (LYS_INFORMAT *)0x0) {
      iVar3 = 0;
      pcVar11 = (char *)0x0;
      goto LAB_0015ca08;
    }
    *format = LVar15;
    iVar3 = 0;
  }
  else {
    __name = (lys_node *)get_current_dir_name();
    if (__name != (lys_node *)0x0) {
      iVar3 = ly_set_add(set,__name,0);
      if (iVar3 == -1) {
LAB_0015ca02:
        iVar3 = 1;
        pcVar11 = (char *)0x0;
        pDVar6 = (DIR *)0x0;
        goto LAB_0015ca08;
      }
      bVar2 = true;
      goto LAB_0015c577;
    }
LAB_0015c967:
    __name = (lys_node *)0x0;
    iVar3 = 1;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile")
    ;
    pDVar6 = (DIR *)0x0;
  }
  pcVar11 = (char *)0x0;
LAB_0015ca08:
  free(local_48);
  free(__name);
  if (pDVar6 != (DIR *)0x0) {
    closedir(pDVar6);
  }
  free(pcVar11);
  if (set->number != 0) {
    uVar13 = 0;
    do {
      free((set->set).s[uVar13]);
      uVar13 = uVar13 + 1;
    } while (uVar13 < set->number);
  }
  ly_set_free(set);
  return iVar3;
}

Assistant:

API int
lys_search_localfile(const char * const *searchpaths, int cwd, const char *name, const char *revision, char **localfile, LYS_INFORMAT *format)
{
    size_t len, flen, match_len = 0, dir_len;
    int i, implicit_cwd = 0, ret = EXIT_FAILURE;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    if (!localfile) {
        LOGARG;
        return EXIT_FAILURE;
    }

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM(NULL);
        return EXIT_FAILURE;
    }

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->set.g[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN(NULL, "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && (dirs->number || !implicit_cwd)) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format_aux = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format_aux = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format_aux;
                            goto success;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format_aux;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(NULL, &file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = EXIT_SUCCESS;

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return ret;
}